

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_color(_garray *x,t_floatarg color)

{
  t_template *x_00;
  t_symbol *ptVar1;
  t_float tVar2;
  t_template *scalartemplate;
  t_float colorwas;
  t_floatarg color_local;
  _garray *x_local;
  
  x_00 = template_findbyname(x->x_scalar->sc_template);
  if (x_00 == (t_template *)0x0) {
    pd_error((void *)0x0,"array: no template of type %s",x->x_scalar->sc_template->s_name);
  }
  else {
    ptVar1 = gensym("color");
    tVar2 = template_getfloat(x_00,ptVar1,x->x_scalar->sc_vec,1);
    if ((color != tVar2) || (NAN(color) || NAN(tVar2))) {
      ptVar1 = gensym("color");
      template_setfloat(x_00,ptVar1,x->x_scalar->sc_vec,color,0);
      garray_redraw(x);
    }
  }
  return;
}

Assistant:

static void garray_color(t_garray *x, t_floatarg color)
{
    t_float colorwas;
    t_template *scalartemplate;
    if (!(scalartemplate = template_findbyname(x->x_scalar->sc_template)))
    {
        pd_error(0, "array: no template of type %s",
            x->x_scalar->sc_template->s_name);
        return;
    }
    colorwas = template_getfloat(
        scalartemplate, gensym("color"), x->x_scalar->sc_vec, 1);
    if (color != colorwas)
    {
        template_setfloat(scalartemplate, gensym("color"),
            x->x_scalar->sc_vec, color, 0);
        garray_redraw(x);
    }
}